

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O3

void __thiscall
ExecutorTest_VariableShadowingWorks_Test::~ExecutorTest_VariableShadowingWorks_Test
          (ExecutorTest_VariableShadowingWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, VariableShadowingWorks)
{
  std::string source = R"SRC(
  let x: f32 = 1;

  fn main(): f32
  {
    let x: f32 = 2;
    print("" : x);
    ret 0;
  }
  )SRC";

  std::string expected = "2.000000\n";

  testProgram(source, expected, 0);
}